

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall ArgTest_CharArg_Test::TestBody(ArgTest_CharArg_Test *this)

{
  mock_visitor<char> *pmVar1;
  MockSpec<test_result_(char)> *this_00;
  MockSpec<test_result_(wchar_t)> *pMVar2;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<char>_> visitor;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  local_f8;
  StrictMock<mock_visitor<char>_> local_d8;
  
  testing::StrictMock<mock_visitor<char>_>::StrictMock(&local_d8);
  testing::Matcher<char>::Matcher((Matcher<char> *)&local_f8,'a');
  pmVar1 = &local_d8.super_mock_visitor<char>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  this_00 = testing::internal::FunctionMocker<test_result_(char)>::With
                      (&pmVar1->gmock1_visit_268,(Matcher<char> *)&local_f8);
  testing::internal::MockSpec<test_result_(char)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x158,"visitor","visit(\'a\')");
  local_f8.value_.field_0.double_value = (double)&PTR__MatcherBase_001d3f18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<char>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<char>_> *)
             ((long)&local_f8.value_.field_0 + 8));
  local_f8.type_ = char_type;
  local_f8.value_.field_0.long_long_value = 0x61;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<char>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_d8,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_f8);
  testing::StrictMock<mock_visitor<char>_>::~StrictMock(&local_d8);
  testing::StrictMock<mock_visitor<wchar_t>_>::StrictMock
            ((StrictMock<mock_visitor<wchar_t>_> *)&local_d8);
  testing::Matcher<wchar_t>::Matcher((Matcher<wchar_t> *)&local_f8,L'a');
  pmVar1 = &local_d8.super_mock_visitor<char>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(wchar_t)>::With
                     ((FunctionMocker<test_result_(wchar_t)> *)pmVar1,(Matcher<wchar_t> *)&local_f8)
  ;
  testing::internal::MockSpec<test_result_(wchar_t)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x159,"visitor","visit(L\'a\')");
  local_f8.value_.field_0.double_value = (double)&PTR__MatcherBase_001d3f48;
  testing::internal::linked_ptr<const_testing::MatcherInterface<wchar_t>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<wchar_t>_> *)
             ((long)&local_f8.value_.field_0 + 8));
  local_f8.type_ = char_type;
  local_f8.value_.field_0.long_long_value = 0x61;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<wchar_t>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<wchar_t>_> *)&local_d8,&local_f8);
  testing::StrictMock<mock_visitor<wchar_t>_>::~StrictMock
            ((StrictMock<mock_visitor<wchar_t>_> *)&local_d8);
  testing::StrictMock<mock_visitor<wchar_t>_>::StrictMock
            ((StrictMock<mock_visitor<wchar_t>_> *)&local_d8);
  testing::Matcher<wchar_t>::Matcher((Matcher<wchar_t> *)&local_f8,L'a');
  pmVar1 = &local_d8.super_mock_visitor<char>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(wchar_t)>::With
                     ((FunctionMocker<test_result_(wchar_t)> *)pmVar1,(Matcher<wchar_t> *)&local_f8)
  ;
  testing::internal::MockSpec<test_result_(wchar_t)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x15a,"visitor","visit(L\'a\')");
  local_f8.value_.field_0.double_value = (double)&PTR__MatcherBase_001d3f48;
  testing::internal::linked_ptr<const_testing::MatcherInterface<wchar_t>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<wchar_t>_> *)
             ((long)&local_f8.value_.field_0 + 8));
  local_f8.type_ = char_type;
  local_f8.value_.field_0.long_long_value = 0x61;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<wchar_t>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<wchar_t>_> *)&local_d8,&local_f8);
  testing::StrictMock<mock_visitor<wchar_t>_>::~StrictMock
            ((StrictMock<mock_visitor<wchar_t>_> *)&local_d8);
  return;
}

Assistant:

TEST(ArgTest, CharArg) {
  CHECK_ARG_(char, 'a', 'a');
  CHECK_ARG_(wchar_t, L'a', 'a');
  CHECK_ARG_(wchar_t, L'a', L'a');
}